

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void Assimp::IFC::AssignMatrixAxes(IfcMatrix4 *out,IfcVector3 *x,IfcVector3 *y,IfcVector3 *z)

{
  IfcVector3 *z_local;
  IfcVector3 *y_local;
  IfcVector3 *x_local;
  IfcMatrix4 *out_local;
  
  out->a1 = x->x;
  out->b1 = x->y;
  out->c1 = x->z;
  out->a2 = y->x;
  out->b2 = y->y;
  out->c2 = y->z;
  out->a3 = z->x;
  out->b3 = z->y;
  out->c3 = z->z;
  return;
}

Assistant:

void AssignMatrixAxes(IfcMatrix4& out, const IfcVector3& x, const IfcVector3& y, const IfcVector3& z)
{
    out.a1 = x.x;
    out.b1 = x.y;
    out.c1 = x.z;

    out.a2 = y.x;
    out.b2 = y.y;
    out.c2 = y.z;

    out.a3 = z.x;
    out.b3 = z.y;
    out.c3 = z.z;
}